

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_coin.cpp
# Opt level: O0

void __thiscall
cfdcapi_coin_CfCoinSelection_BTC1_Test::TestBody(cfdcapi_coin_CfCoinSelection_BTC1_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  char *pcVar4;
  size_type sVar5;
  char *in_R9;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  int64_t amount;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  uint32_t index_1;
  vector<int,_std::allocator<int>_> indexes;
  int32_t utxo_index;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  int64_t utxo_fee_amount;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  ByteData txid;
  Utxo *utxo;
  int32_t index;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  int64_t knapsack_min_change;
  double dust_fee_rate;
  double long_term_fee_rate;
  double effective_fee_rate;
  int64_t tx_fee_amount;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  void *coin_select_handle;
  anon_class_1_0_00000001 convert_to_byte;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  char *kDescriptor;
  undefined1 in_stack_00000eaf;
  bool *in_stack_fffffffffffffa48;
  char *in_stack_fffffffffffffa50;
  void **in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa60;
  undefined4 uVar6;
  uint32_t in_stack_fffffffffffffa64;
  void **in_stack_fffffffffffffa68;
  int32_t in_stack_fffffffffffffa74;
  void *in_stack_fffffffffffffa78;
  undefined7 in_stack_fffffffffffffa80;
  undefined1 in_stack_fffffffffffffa87;
  undefined4 in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  char *in_stack_fffffffffffffa98;
  size_t in_stack_fffffffffffffaa8;
  undefined7 in_stack_fffffffffffffab0;
  undefined1 in_stack_fffffffffffffab7;
  anon_class_1_0_00000001 *in_stack_fffffffffffffab8;
  undefined7 in_stack_fffffffffffffad0;
  undefined1 in_stack_fffffffffffffad7;
  char *in_stack_fffffffffffffad8;
  undefined7 in_stack_fffffffffffffb70;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *this_00;
  uint32_t index_00;
  void *coin_select_handle_00;
  undefined4 in_stack_fffffffffffffb88;
  AssertHelper local_448;
  Message local_440;
  undefined4 local_434;
  AssertionResult local_430;
  AssertHelper local_420;
  Message local_418;
  undefined4 local_40c;
  char *in_stack_fffffffffffffbf8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffc00;
  uint32_t in_stack_fffffffffffffc0c;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  AssertionResult local_3e0;
  AssertHelper local_3d0;
  Message local_3c8;
  undefined4 local_3bc;
  AssertionResult local_3b8;
  undefined8 local_3a8;
  AssertHelper local_3a0;
  Message local_398;
  undefined4 local_38c;
  AssertionResult local_388;
  AssertHelper local_378;
  Message local_370;
  undefined4 local_364;
  AssertionResult local_360;
  AssertHelper local_350;
  Message local_348;
  undefined4 local_33c;
  AssertionResult local_338;
  AssertHelper local_328;
  Message local_320;
  undefined4 local_314;
  AssertionResult local_310;
  AssertHelper in_stack_fffffffffffffd00;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd08;
  double in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  int64_t in_stack_fffffffffffffd20;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd28;
  uint32_t in_stack_fffffffffffffd30;
  uint32_t in_stack_fffffffffffffd34;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd38;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd50;
  uint local_2a4;
  vector<int,_std::allocator<int>_> local_2a0;
  int local_284;
  AssertHelper local_280;
  Message local_278;
  undefined4 local_26c;
  AssertionResult local_268;
  AssertHelper local_258;
  Message local_250;
  undefined4 local_244;
  AssertionResult local_240;
  undefined8 local_230;
  AssertHelper local_228;
  Message local_220;
  undefined4 local_214;
  AssertionResult local_210;
  AssertHelper local_200;
  Message local_1f8;
  undefined4 local_1ec;
  AssertionResult local_1e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1d8;
  ByteData256 local_1c0;
  Txid local_1a8;
  string local_188;
  int64_t *in_stack_fffffffffffffea8;
  reference in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  int iVar7;
  int iVar8;
  AssertHelper local_140;
  Message local_138;
  undefined8 local_130;
  AssertionResult local_128;
  AssertHelper local_118;
  Message local_110;
  undefined4 local_104;
  AssertionResult local_100;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_c8;
  undefined8 local_b0;
  string local_a0;
  AssertHelper local_80;
  Message local_78;
  undefined1 local_69;
  AssertionResult local_68;
  AssertHelper local_58;
  Message local_50 [3];
  undefined4 local_34;
  AssertionResult local_30;
  int local_1c;
  void *local_18;
  char *local_10;
  
  local_10 = 
  "sh(wpkh([ef735203/0\'/0\'/7\']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x"
  ;
  local_18 = (void *)0x0;
  local_1c = CfdCreateHandle(in_stack_fffffffffffffa68);
  local_34 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffa68,
             (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             (CfdErrorCode *)in_stack_fffffffffffffa58,(int *)in_stack_fffffffffffffa50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_30);
  if (!bVar1) {
    testing::Message::Message(local_50);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x30fcb9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x2b1,pcVar4);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message((Message *)0x30fd1c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x30fd71);
  local_69 = local_18 != (void *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,(type *)0x30fda5
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)&local_68,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x2b2,pcVar4);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    testing::Message::~Message((Message *)0x30fea1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x30ff1c);
  local_b0 = 0;
  this_00 = &local_c8;
  CfdGetElementsUtxoListByC((bool)in_stack_00000eaf);
  local_d0 = 2000;
  local_d8 = 0x4034000000000000;
  local_e0 = 0x4034000000000000;
  local_e8 = 0xbff0000000000000;
  local_f0 = 0xffffffffffffffff;
  coin_select_handle_00 = local_18;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(this_00);
  iVar3 = CfdInitializeCoinSelection
                    (in_stack_fffffffffffffd38.ptr_,in_stack_fffffffffffffd34,
                     in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28.ptr_,
                     in_stack_fffffffffffffd20,
                     (double)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                     in_stack_fffffffffffffd10,(double)in_stack_fffffffffffffd08.ptr_,
                     (int64_t)in_stack_fffffffffffffd00.data_,
                     (void **)in_stack_fffffffffffffd50.ptr_);
  local_104 = 0;
  local_1c = iVar3;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffa68,
             (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             (CfdErrorCode *)in_stack_fffffffffffffa58,(int *)in_stack_fffffffffffffa50);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_100);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_110);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3100cb);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x2c7,pcVar4);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    testing::Message::~Message((Message *)0x31012e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x310183);
  local_130 = 0;
  testing::internal::CmpHelperNE<decltype(nullptr),void*>
            ((char *)in_stack_fffffffffffffa68,
             (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             in_stack_fffffffffffffa58,(void **)in_stack_fffffffffffffa50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x31022b);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x2c8,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message((Message *)0x31028e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3102e6);
  if (local_1c == 0) {
    iVar7 = 0;
    while (iVar8 = iVar7,
          sVar5 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_c8),
          iVar7 < (int)sVar5) {
      in_stack_fffffffffffffeb0 =
           std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_c8,(long)iVar8);
      TestBody::anon_class_1_0_00000001::operator()
                (in_stack_fffffffffffffab8,
                 (uint8_t *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0),
                 in_stack_fffffffffffffaa8);
      cfd::core::ByteData::GetBytes(&local_1d8,(ByteData *)&stack0xfffffffffffffe98);
      cfd::core::ByteData256::ByteData256(&local_1c0,&local_1d8);
      cfd::core::Txid::Txid(&local_1a8,&local_1c0);
      cfd::core::Txid::GetHex_abi_cxx11_(&local_188,&local_1a8);
      std::__cxx11::string::c_str();
      in_stack_fffffffffffffa50 =
           "sh(wpkh([ef735203/0\'/0\'/7\']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x"
      ;
      local_1c = CfdAddCoinSelectionUtxo
                           ((void *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                            in_stack_fffffffffffffa78,in_stack_fffffffffffffa74,
                            (char *)in_stack_fffffffffffffa68,in_stack_fffffffffffffa64,
                            (int64_t)in_stack_fffffffffffffa58,
                            (char *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                            in_stack_fffffffffffffa98);
      std::__cxx11::string::~string((string *)&local_188);
      cfd::core::Txid::~Txid((Txid *)0x310483);
      cfd::core::ByteData256::~ByteData256((ByteData256 *)0x310490);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
      local_1ec = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffffa68,
                 (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                 (CfdErrorCode *)in_stack_fffffffffffffa58,(int *)in_stack_fffffffffffffa50);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
      if (!bVar1) {
        testing::Message::Message(&local_1f8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3105ef);
        testing::internal::AssertHelper::AssertHelper
                  (&local_200,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x2d4,pcVar4);
        testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
        testing::internal::AssertHelper::~AssertHelper(&local_200);
        testing::Message::~Message((Message *)0x310652);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3106a7);
      cfd::core::ByteData::~ByteData((ByteData *)0x3106b4);
      iVar7 = iVar8 + 1;
    }
    local_1c = CfdAddCoinSelectionAmount
                         ((void *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                          in_stack_fffffffffffffc10.ptr_,in_stack_fffffffffffffc0c,
                          (int64_t)in_stack_fffffffffffffc00.ptr_,in_stack_fffffffffffffbf8);
    local_214 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffa68,
               (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               (CfdErrorCode *)in_stack_fffffffffffffa58,(int *)in_stack_fffffffffffffa50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_210);
    if (!bVar1) {
      testing::Message::Message(&local_220);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3107b8);
      testing::internal::AssertHelper::AssertHelper
                (&local_228,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x2d8,pcVar4);
      testing::internal::AssertHelper::operator=(&local_228,&local_220);
      testing::internal::AssertHelper::~AssertHelper(&local_228);
      testing::Message::~Message((Message *)0x31081b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x310873);
    local_230 = 0;
    local_1c = CfdFinalizeCoinSelection
                         ((void *)CONCAT44(iVar8,in_stack_fffffffffffffeb8),
                          in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    local_244 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffa68,
               (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               (CfdErrorCode *)in_stack_fffffffffffffa58,(int *)in_stack_fffffffffffffa50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_240);
    if (!bVar1) {
      testing::Message::Message(&local_250);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x31095a);
      testing::internal::AssertHelper::AssertHelper
                (&local_258,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x2dc,pcVar4);
      testing::internal::AssertHelper::operator=(&local_258,&local_250);
      testing::internal::AssertHelper::~AssertHelper(&local_258);
      testing::Message::~Message((Message *)0x3109bd);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x310a12);
    local_26c = 0x1cc0;
    testing::internal::EqHelper<false>::Compare<int,long>
              ((char *)in_stack_fffffffffffffa68,
               (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               (int *)in_stack_fffffffffffffa58,(long *)in_stack_fffffffffffffa50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_268);
    if (!bVar1) {
      testing::Message::Message(&local_278);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x310ab9);
      testing::internal::AssertHelper::AssertHelper
                (&local_280,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x2dd,pcVar4);
      testing::internal::AssertHelper::operator=(&local_280,&local_278);
      testing::internal::AssertHelper::~AssertHelper(&local_280);
      testing::Message::~Message((Message *)0x310b1c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x310b74);
    local_284 = 0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x310b8c);
    local_2a4 = 0;
    while( true ) {
      sVar5 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_c8);
      index_00 = (uint32_t)((ulong)this_00 >> 0x20);
      if (sVar5 <= local_2a4) break;
      local_1c = CfdGetSelectedCoinIndex
                           ((void *)CONCAT44(iVar3,in_stack_fffffffffffffb88),coin_select_handle_00,
                            index_00,(int32_t *)CONCAT17(uVar2,in_stack_fffffffffffffb70));
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffffa68,
                 (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                 (CfdErrorCode *)in_stack_fffffffffffffa58,(int *)in_stack_fffffffffffffa50);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffd48);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffffd38);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x310cc2);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffd30,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x2e4,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffd30,(Message *)&stack0xfffffffffffffd38);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd30);
        testing::Message::~Message((Message *)0x310d25);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x310d7a);
      index_00 = (uint32_t)((ulong)this_00 >> 0x20);
      if (local_284 == -1) break;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                 (value_type_conflict2 *)in_stack_fffffffffffffa58);
      local_2a4 = local_2a4 + 1;
    }
    std::vector<int,_std::allocator<int>_>::size(&local_2a0);
    testing::internal::EqHelper<false>::Compare<int,unsigned_long>
              ((char *)in_stack_fffffffffffffa68,
               (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               (int *)in_stack_fffffffffffffa58,(unsigned_long *)in_stack_fffffffffffffa50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffd20);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffd08);
      in_stack_fffffffffffffad8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x310e71);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffd00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x2ea,in_stack_fffffffffffffad8);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffd00,(Message *)&stack0xfffffffffffffd08);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd00);
      testing::Message::~Message((Message *)0x310ed4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x310f2c);
    sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_2a0);
    if (sVar5 == 4) {
      local_314 = 1;
      std::vector<int,_std::allocator<int>_>::operator[](&local_2a0,0);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((char *)in_stack_fffffffffffffa68,
                 (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                 (int *)in_stack_fffffffffffffa58,(int *)in_stack_fffffffffffffa50);
      in_stack_fffffffffffffad7 = testing::AssertionResult::operator_cast_to_bool(&local_310);
      if (!(bool)in_stack_fffffffffffffad7) {
        testing::Message::Message(&local_320);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x310ff6);
        testing::internal::AssertHelper::AssertHelper
                  (&local_328,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x2ed,pcVar4);
        testing::internal::AssertHelper::operator=(&local_328,&local_320);
        testing::internal::AssertHelper::~AssertHelper(&local_328);
        testing::Message::~Message((Message *)0x311059);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3110ae);
      local_33c = 3;
      std::vector<int,_std::allocator<int>_>::operator[](&local_2a0,1);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((char *)in_stack_fffffffffffffa68,
                 (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                 (int *)in_stack_fffffffffffffa58,(int *)in_stack_fffffffffffffa50);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_338);
      if (!bVar1) {
        testing::Message::Message(&local_348);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x31115c);
        testing::internal::AssertHelper::AssertHelper
                  (&local_350,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x2ee,pcVar4);
        testing::internal::AssertHelper::operator=(&local_350,&local_348);
        testing::internal::AssertHelper::~AssertHelper(&local_350);
        testing::Message::~Message((Message *)0x3111b9);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x31120e);
      local_364 = 10;
      std::vector<int,_std::allocator<int>_>::operator[](&local_2a0,2);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((char *)in_stack_fffffffffffffa68,
                 (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                 (int *)in_stack_fffffffffffffa58,(int *)in_stack_fffffffffffffa50);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_360);
      if (!bVar1) {
        testing::Message::Message(&local_370);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3112bc);
        testing::internal::AssertHelper::AssertHelper
                  (&local_378,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x2ef,pcVar4);
        testing::internal::AssertHelper::operator=(&local_378,&local_370);
        testing::internal::AssertHelper::~AssertHelper(&local_378);
        testing::Message::~Message((Message *)0x311319);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x31136e);
      local_38c = 6;
      std::vector<int,_std::allocator<int>_>::operator[](&local_2a0,3);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((char *)in_stack_fffffffffffffa68,
                 (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                 (int *)in_stack_fffffffffffffa58,(int *)in_stack_fffffffffffffa50);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_388);
      if (!bVar1) {
        testing::Message::Message(&local_398);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x31141c);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x2f0,pcVar4);
        testing::internal::AssertHelper::operator=(&local_3a0,&local_398);
        testing::internal::AssertHelper::~AssertHelper(&local_3a0);
        testing::Message::~Message((Message *)0x311479);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3114ce);
    }
    local_3a8 = 0;
    local_1c = CfdGetSelectedCoinAssetAmount
                         ((void *)CONCAT44(iVar3,in_stack_fffffffffffffb88),coin_select_handle_00,
                          index_00,(int64_t *)CONCAT17(uVar2,in_stack_fffffffffffffb70));
    local_3bc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffa68,
               (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               (CfdErrorCode *)in_stack_fffffffffffffa58,(int *)in_stack_fffffffffffffa50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3b8);
    if (!bVar1) {
      testing::Message::Message(&local_3c8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3115ad);
      testing::internal::AssertHelper::AssertHelper
                (&local_3d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x301,pcVar4);
      testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
      testing::internal::AssertHelper::~AssertHelper(&local_3d0);
      testing::Message::~Message((Message *)0x31160a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x31165f);
    testing::internal::EqHelper<false>::Compare<int,long>
              ((char *)in_stack_fffffffffffffa68,
               (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               (int *)in_stack_fffffffffffffa58,(long *)in_stack_fffffffffffffa50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e0);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffc10);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x311700);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffc08,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x302,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffc08,(Message *)&stack0xfffffffffffffc10);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc08);
      testing::Message::~Message((Message *)0x31175d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3117b2);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
  }
  local_1c = CfdFreeCoinSelectionHandle
                       (in_stack_fffffffffffffad8,
                        (void *)CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0));
  local_40c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffa68,
             (char *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             (CfdErrorCode *)in_stack_fffffffffffffa58,(int *)in_stack_fffffffffffffa50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffbf8);
  if (!bVar1) {
    testing::Message::Message(&local_418);
    in_stack_fffffffffffffa68 =
         (void **)testing::AssertionResult::failure_message((AssertionResult *)0x311895);
    testing::internal::AssertHelper::AssertHelper
              (&local_420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x305,(char *)in_stack_fffffffffffffa68);
    testing::internal::AssertHelper::operator=(&local_420,&local_418);
    testing::internal::AssertHelper::~AssertHelper(&local_420);
    testing::Message::~Message((Message *)0x3118f2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x31194a);
  iVar3 = CfdFreeHandle(in_stack_fffffffffffffa58);
  local_434 = 0;
  local_1c = iVar3;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffa68,(char *)CONCAT44(iVar3,in_stack_fffffffffffffa60),
             (CfdErrorCode *)in_stack_fffffffffffffa58,(int *)in_stack_fffffffffffffa50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_430);
  uVar6 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa60);
  if (!bVar1) {
    testing::Message::Message(&local_440);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x311a09);
    testing::internal::AssertHelper::AssertHelper
              (&local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x308,pcVar4);
    testing::internal::AssertHelper::operator=(&local_448,&local_440);
    testing::internal::AssertHelper::~AssertHelper(&local_448);
    testing::Message::~Message((Message *)0x311a66);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x311abb);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)CONCAT44(iVar3,uVar6));
  return;
}

Assistant:

TEST(cfdcapi_coin, CfCoinSelection_BTC1) {
  constexpr const char* kDescriptor = "sh(wpkh([ef735203/0'/0'/7']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x";
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  auto convert_to_byte = [](const uint8_t* byte_array, size_t size) -> ByteData {
    std::vector<uint8_t> bytes(size);
    memcpy(bytes.data(), byte_array, bytes.size());
    return ByteData(bytes);
  };

  void* coin_select_handle = nullptr;
  std::vector<Utxo> utxos = CfdGetElementsUtxoListByC(false);
  int64_t tx_fee_amount = 2000;
  double effective_fee_rate = 20;
  double long_term_fee_rate = 20;
  double dust_fee_rate = -1;
  int64_t knapsack_min_change = -1;

  ret = CfdInitializeCoinSelection(
    handle, static_cast<uint32_t>(utxos.size()), 3,
    "", tx_fee_amount,
    effective_fee_rate, long_term_fee_rate, dust_fee_rate,
    knapsack_min_change, &coin_select_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_NE(nullptr, coin_select_handle);

  if (ret == kCfdSuccess) {
    for (int32_t index = 0; index < static_cast<int32_t>(utxos.size()); ++index) {
      const Utxo& utxo = utxos[index];
      ByteData txid = convert_to_byte(utxo.txid, sizeof(utxo.txid));
      ret = CfdAddCoinSelectionUtxo(
          handle, coin_select_handle, index,
          Txid(ByteData256(txid.GetBytes())).GetHex().c_str(), utxo.vout,
          utxo.amount,
          "",
          kDescriptor);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    ret = CfdAddCoinSelectionAmount(handle, coin_select_handle, 0, 180000000, "");
    EXPECT_EQ(kCfdSuccess, ret);

    int64_t utxo_fee_amount = 0;
    ret = CfdFinalizeCoinSelection(handle, coin_select_handle, &utxo_fee_amount);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(7360, utxo_fee_amount);

    int32_t utxo_index = 0;
    std::vector<int32_t> indexes;
    for (uint32_t index = 0; index < utxos.size(); ++index) {
      ret = CfdGetSelectedCoinIndex(
          handle, coin_select_handle, index, &utxo_index);
      EXPECT_EQ(kCfdSuccess, ret);
      if (utxo_index == -1) {
        break;
      }
      indexes.push_back(utxo_index);
    }
    EXPECT_EQ(4, indexes.size());

    if (indexes.size() == 4) {
      EXPECT_EQ(1, indexes[0]);
      EXPECT_EQ(3, indexes[1]);
      EXPECT_EQ(10, indexes[2]);
      EXPECT_EQ(6, indexes[3]);
      /*
      req:
            A,  115800000
            B,  347180050
            C,   37654200
      res:
        8:  B,  346430050
        7:  B,     750000
        10: C,   37654200
        1:  A,   78125000
        3:  A,   39062500
      */
    }

    int64_t amount = 0;
    ret = CfdGetSelectedCoinAssetAmount(handle, coin_select_handle, 0, &amount);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(181760100, amount);
  }
  ret = CfdFreeCoinSelectionHandle(handle, coin_select_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}